

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

SUNErrCode N_VDotProdMulti_Serial(int nvec,N_Vector x,N_Vector *Y,sunrealtype *dotprods)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  sunrealtype sVar6;
  
  if (nvec == 1) {
    lVar1 = *x->content;
    if (lVar1 < 1) {
      sVar6 = 0.0;
    }
    else {
      sVar6 = 0.0;
      lVar3 = 0;
      do {
        sVar6 = sVar6 + *(double *)(*(long *)((long)x->content + 0x10) + lVar3 * 8) *
                        *(double *)(*(long *)((long)(*Y)->content + 0x10) + lVar3 * 8);
        lVar3 = lVar3 + 1;
      } while (lVar1 != lVar3);
    }
    *dotprods = sVar6;
  }
  else if (0 < nvec) {
    lVar1 = *x->content;
    lVar3 = *(long *)((long)x->content + 0x10);
    uVar4 = 0;
    do {
      lVar2 = *(long *)((long)Y[uVar4]->content + 0x10);
      dotprods[uVar4] = 0.0;
      if (0 < lVar1) {
        sVar6 = dotprods[uVar4];
        lVar5 = 0;
        do {
          sVar6 = sVar6 + *(double *)(lVar3 + lVar5 * 8) * *(double *)(lVar2 + lVar5 * 8);
          dotprods[uVar4] = sVar6;
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nvec);
  }
  return 0;
}

Assistant:

SUNErrCode N_VDotProdMulti_Serial(int nvec, N_Vector x, N_Vector* Y,
                                  sunrealtype* dotprods)
{
  SUNFunctionBegin(x->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VDotProd */
  if (nvec == 1)
  {
    dotprods[0] = N_VDotProd_Serial(x, Y[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /* compute multiple dot products */
  for (i = 0; i < nvec; i++)
  {
    yd          = NV_DATA_S(Y[i]);
    dotprods[i] = ZERO;
    for (j = 0; j < N; j++) { dotprods[i] += xd[j] * yd[j]; }
  }

  return SUN_SUCCESS;
}